

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O1

uint aom_obmc_variance8x32_sse4_1(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  uint8_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar19 [16];
  
  puVar4 = pre + 4;
  uVar3 = 0xfffffffffffffff8;
  auVar7 = pmovsxwd(in_XMM2,0x800080008000800);
  auVar5 = (undefined1  [16])0x0;
  auVar6 = (undefined1  [16])0x0;
  do {
    auVar18 = pmovzxbd(in_XMM5,*(undefined4 *)puVar4);
    piVar1 = wsrc + uVar3 + 8;
    piVar2 = wsrc + uVar3 + 0xc;
    auVar19 = pmovzxbd(in_XMM6,*(undefined4 *)(puVar4 + -4));
    in_XMM6 = pmaddwd(auVar19,*(undefined1 (*) [16])(mask + uVar3 + 8));
    auVar18 = pmaddwd(auVar18,*(undefined1 (*) [16])(mask + uVar3 + 0xc));
    iVar12 = *piVar1 - in_XMM6._0_4_;
    iVar15 = piVar1[1] - in_XMM6._4_4_;
    iVar16 = piVar1[2] - in_XMM6._8_4_;
    iVar17 = piVar1[3] - in_XMM6._12_4_;
    iVar8 = *piVar2 - auVar18._0_4_;
    iVar9 = piVar2[1] - auVar18._4_4_;
    iVar10 = piVar2[2] - auVar18._8_4_;
    iVar11 = piVar2[3] - auVar18._12_4_;
    auVar13._0_4_ = iVar12 + auVar7._0_4_ + (iVar12 >> 0x1f) >> 0xc;
    auVar13._4_4_ = iVar15 + auVar7._4_4_ + (iVar15 >> 0x1f) >> 0xc;
    auVar13._8_4_ = iVar16 + auVar7._8_4_ + (iVar16 >> 0x1f) >> 0xc;
    auVar13._12_4_ = iVar17 + auVar7._12_4_ + (iVar17 >> 0x1f) >> 0xc;
    in_XMM5._0_4_ = iVar8 >> 0x1f;
    in_XMM5._4_4_ = iVar9 >> 0x1f;
    in_XMM5._8_4_ = iVar10 >> 0x1f;
    in_XMM5._12_4_ = iVar11 >> 0x1f;
    auVar19._0_4_ = iVar8 + auVar7._0_4_ + in_XMM5._0_4_ >> 0xc;
    auVar19._4_4_ = iVar9 + auVar7._4_4_ + in_XMM5._4_4_ >> 0xc;
    auVar19._8_4_ = iVar10 + auVar7._8_4_ + in_XMM5._8_4_ >> 0xc;
    auVar19._12_4_ = iVar11 + auVar7._12_4_ + in_XMM5._12_4_ >> 0xc;
    iVar8 = auVar5._4_4_;
    iVar9 = auVar5._8_4_;
    iVar10 = auVar5._12_4_;
    auVar18 = packssdw(auVar13,auVar19);
    auVar14 = pmaddwd(auVar18,auVar18);
    auVar18._0_4_ = auVar6._0_4_ + auVar14._0_4_;
    auVar18._4_4_ = auVar6._4_4_ + auVar14._4_4_;
    auVar18._8_4_ = auVar6._8_4_ + auVar14._8_4_;
    auVar18._12_4_ = auVar6._12_4_ + auVar14._12_4_;
    auVar5._0_4_ = auVar5._0_4_ + auVar13._0_4_ + auVar19._0_4_;
    auVar5._4_4_ = iVar8 + auVar13._4_4_ + auVar19._4_4_;
    auVar5._8_4_ = iVar9 + auVar13._8_4_ + auVar19._8_4_;
    auVar5._12_4_ = iVar10 + auVar13._12_4_ + auVar19._12_4_;
    uVar3 = uVar3 + 8;
    puVar4 = puVar4 + (long)(pre_stride + -8) + 8;
    auVar6 = auVar18;
  } while (uVar3 < 0xf8);
  auVar6 = phaddd(auVar5,auVar5);
  auVar5 = phaddd(auVar6,auVar6);
  auVar6 = phaddd(auVar18,auVar18);
  auVar6 = phaddd(auVar6,auVar6);
  *sse = auVar6._0_4_;
  return auVar6._0_4_ - (int)((ulong)((long)auVar5._0_4_ * (long)auVar5._0_4_) >> 8);
}

Assistant:

static inline void obmc_variance_w8n(const uint8_t *pre, const int pre_stride,
                                     const int32_t *wsrc, const int32_t *mask,
                                     unsigned int *const sse, int *const sum,
                                     const int w, const int h) {
  const int pre_step = pre_stride - w;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(w >= 8);
  assert(IS_POWER_OF_TWO(w));
  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p1_b = xx_loadl_32(pre + n + 4);
    const __m128i v_m1_d = xx_load_128(mask + n + 4);
    const __m128i v_w1_d = xx_load_128(wsrc + n + 4);
    const __m128i v_p0_b = xx_loadl_32(pre + n);
    const __m128i v_m0_d = xx_load_128(mask + n);
    const __m128i v_w0_d = xx_load_128(wsrc + n);

    const __m128i v_p0_d = _mm_cvtepu8_epi32(v_p0_b);
    const __m128i v_p1_d = _mm_cvtepu8_epi32(v_p1_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm0_d = _mm_madd_epi16(v_p0_d, v_m0_d);
    const __m128i v_pm1_d = _mm_madd_epi16(v_p1_d, v_m1_d);

    const __m128i v_diff0_d = _mm_sub_epi32(v_w0_d, v_pm0_d);
    const __m128i v_diff1_d = _mm_sub_epi32(v_w1_d, v_pm1_d);

    const __m128i v_rdiff0_d = xx_roundn_epi32(v_diff0_d, 12);
    const __m128i v_rdiff1_d = xx_roundn_epi32(v_diff1_d, 12);
    const __m128i v_rdiff01_w = _mm_packs_epi32(v_rdiff0_d, v_rdiff1_d);
    const __m128i v_sqrdiff_d = _mm_madd_epi16(v_rdiff01_w, v_rdiff01_w);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff0_d);
    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff1_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 8;

    if (n % w == 0) pre += pre_step;
  } while (n < w * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}